

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumePattern
          (ParsedPatternInfo *this,UnicodeString *patternString,UErrorCode *status)

{
  ParserState *this_00;
  UChar32 UVar1;
  uint uVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  UnicodeString::operator=(&this->pattern,patternString);
  this->currentSubpattern = &this->positive;
  consumeSubpattern(this,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &this->state;
    UVar1 = ParserState::peek(this_00);
    if (UVar1 == 0x3b) {
      uVar2 = ParserState::peek(this_00);
      (this->state).offset = ((this->state).offset - (uint)(uVar2 < 0x10000)) + 2;
      UVar1 = ParserState::peek(this_00);
      if (UVar1 != -1) {
        this->fHasNegativeSubpattern = true;
        this->currentSubpattern = &this->negative;
        consumeSubpattern(this,status);
        if (U_ZERO_ERROR < *status) {
          return;
        }
      }
    }
    UVar1 = ParserState::peek(this_00);
    if (UVar1 != -1) {
      *status = U_UNQUOTED_SPECIAL;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }